

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSurfaceNurbs.cpp
# Opt level: O2

void __thiscall chrono::geometry::ChSurfaceNurbs::ChSurfaceNurbs(ChSurfaceNurbs *this)

{
  Scalar *pSVar1;
  ChMatrixDynamic<ChVector<>_> mpoints;
  int local_28;
  int local_24;
  
  (this->super_ChSurface).wireframe = false;
  (this->super_ChSurface).super_ChGeometry._vptr_ChGeometry =
       (_func_int **)&PTR__ChSurfaceNurbs_0118b730;
  (this->points).super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
  m_storage.m_data = (ChVector<double> *)0x0;
  (this->points).super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->points).super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
       = 0;
  (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  (this->points).super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
  m_storage.m_cols = 0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols
       = 0;
  (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  (this->knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0;
  local_28 = 2;
  local_24 = local_28;
  Eigen::Matrix<chrono::ChVector<double>,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<chrono::ChVector<double>,_1,_1,1,_1,_1> *)&mpoints,&local_24,&local_28);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<chrono::ChVector<double>,_-1,_-1,_1,_-1,_-1>,_1>::
           operator()((DenseCoeffsBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>,_1>
                       *)&mpoints,0,0);
  pSVar1->m_data[0] = (double)&DAT_bff0000000000000;
  pSVar1->m_data[1] = (double)&DAT_bff0000000000000;
  pSVar1->m_data[2] = 0.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<chrono::ChVector<double>,_-1,_-1,_1,_-1,_-1>,_1>::
           operator()((DenseCoeffsBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>,_1>
                       *)&mpoints,1,0);
  pSVar1->m_data[0] = 1.0;
  pSVar1->m_data[1] = (double)&DAT_bff0000000000000;
  pSVar1->m_data[2] = 0.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<chrono::ChVector<double>,_-1,_-1,_1,_-1,_-1>,_1>::
           operator()((DenseCoeffsBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>,_1>
                       *)&mpoints,0,1);
  pSVar1->m_data[0] = (double)&DAT_bff0000000000000;
  pSVar1->m_data[1] = 1.0;
  pSVar1->m_data[2] = 0.0;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<chrono::ChVector<double>,_-1,_-1,_1,_-1,_-1>,_1>::
           operator()((DenseCoeffsBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>,_1>
                       *)&mpoints,1,1);
  pSVar1->m_data[0] = 1.0;
  pSVar1->m_data[1] = 1.0;
  pSVar1->m_data[2] = 0.0;
  (*(this->super_ChSurface).super_ChGeometry._vptr_ChGeometry[0xf])(this,1,1,&mpoints,0,0,0);
  Eigen::internal::handmade_aligned_free
            (mpoints.
             super_PlainObjectBase<Eigen::Matrix<chrono::ChVector<double>,__1,__1,_1,__1,__1>_>.
             m_storage.m_data);
  return;
}

Assistant:

ChSurfaceNurbs::ChSurfaceNurbs() {
    ChMatrixDynamic<ChVector<>> mpoints(2, 2);
    mpoints(0, 0) = ChVector<>(-1, -1, 0);
    mpoints(1, 0) = ChVector<>(1, -1, 0);
    mpoints(0, 1) = ChVector<>(-1, 1, 0);
    mpoints(1, 1) = ChVector<>(1, 1, 0);
    this->SetupData(1, 1, mpoints);
}